

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_base.h
# Opt level: O2

void mp::
     WriteModelItem<fmt::BasicMemoryWriter<char,std::allocator<char>>,std::vector<int,std::allocator<int>>,int>
               (BasicMemoryWriter<char,_std::allocator<char>_> *wrt,
               vector<int,_std::allocator<int>_> *v,ItemNamer *vnam)

{
  int *piVar1;
  char *__s;
  size_t sVar2;
  int *el;
  int *piVar3;
  int iVar4;
  bool bVar5;
  BasicStringRef<char> value;
  BasicStringRef<char> value_00;
  
  fmt::BasicWriter<char>::operator<<(&wrt->super_BasicWriter<char>,'[');
  piVar1 = (v->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  iVar4 = 0;
  for (piVar3 = (v->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
                _M_start; piVar3 != piVar1; piVar3 = piVar3 + 1) {
    bVar5 = iVar4 != 0;
    iVar4 = iVar4 + -1;
    if (bVar5) {
      value.size_ = 2;
      value.data_ = ", ";
      fmt::BasicWriter<char>::operator<<(&wrt->super_BasicWriter<char>,value);
    }
    __s = ItemNamer::at(vnam,(long)*piVar3);
    sVar2 = strlen(__s);
    value_00.size_ = sVar2;
    value_00.data_ = __s;
    fmt::BasicWriter<char>::operator<<(&wrt->super_BasicWriter<char>,value_00);
  }
  fmt::BasicWriter<char>::operator<<(&wrt->super_BasicWriter<char>,']');
  return;
}

Assistant:

inline void WriteModelItem(
    Writer& wrt, const Vec& v,
    ItemNamer& vnam) {
  static_assert (
  std::is_integral_v<typename Vec::value_type>, "Variable vector: need int's");
  wrt << '[';
  int n=-1;
  for (const auto& el: v) {
    if (++n)
      wrt << ", ";
    wrt << vnam.at(el);
  }
  wrt << ']';
}